

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O3

void __thiscall
TPZMHMeshControl::TPZMHMeshControl
          (TPZMHMeshControl *this,TPZAutoPointer<TPZGeoMesh> *gmesh,TPZVec<long> *geotomhm)

{
  atomic_int *paVar1;
  TPZAutoPointer<TPZCompMesh> *this_00;
  _Rb_tree_header *p_Var2;
  TPZReference *pTVar3;
  ulong uVar4;
  long *plVar5;
  TPZAutoPointer<TPZGeoMesh> *pTVar6;
  TPZReference *pTVar7;
  long *plVar8;
  mapped_type_conflict *pmVar9;
  TPZMultiphysicsCompMesh *this_01;
  ulong uVar10;
  long lVar11;
  long lVar12;
  TPZAutoPointer<TPZGeoMesh> local_50;
  TPZManVector<long,_10> *local_48;
  TPZAutoPointer<TPZCompMesh> *local_40;
  TPZAutoPointer<TPZGeoMesh> *local_38;
  
  this->_vptr_TPZMHMeshControl = (_func_int **)&PTR__TPZMHMeshControl_019e0a08;
  local_38 = &this->fGMesh;
  pTVar3 = gmesh->fRef;
  (this->fGMesh).fRef = pTVar3;
  LOCK();
  paVar1 = &pTVar3->fCounter;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  pTVar7 = (TPZReference *)operator_new(0x10);
  this_00 = &this->fCMesh;
  (pTVar7->fCounter).super___atomic_base<int>._M_i = 0;
  pTVar7->fPointer = (TPZCompMesh *)0x0;
  LOCK();
  (pTVar7->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fCMesh).fRef = pTVar7;
  pTVar7 = (TPZReference *)operator_new(0x10);
  (pTVar7->fCounter).super___atomic_base<int>._M_i = 0;
  pTVar7->fPointer = (TPZCompMesh *)0x0;
  LOCK();
  (pTVar7->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fCMeshLagrange).fRef = pTVar7;
  pTVar7 = (TPZReference *)operator_new(0x10);
  (pTVar7->fCounter).super___atomic_base<int>._M_i = 0;
  pTVar7->fPointer = (TPZCompMesh *)0x0;
  LOCK();
  (pTVar7->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fCMeshConstantPressure).fRef = pTVar7;
  pTVar7 = (TPZReference *)operator_new(0x10);
  (pTVar7->fCounter).super___atomic_base<int>._M_i = 0;
  pTVar7->fPointer = (TPZCompMesh *)0x0;
  LOCK();
  (pTVar7->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  local_40 = &this->fPressureFineMesh;
  (this->fPressureFineMesh).fRef = pTVar7;
  this->fProblemType = EScalar;
  this->fNState = 1;
  this->fSkeletonMatId = 4;
  this->fSecondSkeletonMatId = 3;
  this->fPressureSkeletonMatId = 6;
  this->fLagrangeMatIdLeft = 0x226;
  this->fLagrangeMatIdRight = 0x227;
  p_Var2 = &(this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header;
  (this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->fpOrderInternal = 1;
  this->fpOrderSkeleton = 1;
  this->fHdivmaismais = 0;
  this->fSkeletonWrapMatId = 500;
  this->fBoundaryWrapMatId = 0x1f6;
  this->fInternalWrapMatId = 0x1f5;
  local_48 = &this->fGeoToMHMDomain;
  (this->fGeoToMHMDomain).super_TPZVec<long>.fStore = (long *)0x0;
  (this->fGeoToMHMDomain).super_TPZVec<long>.fNElements = 0;
  (this->fGeoToMHMDomain).super_TPZVec<long>.fNAlloc = 0;
  (this->fGeoToMHMDomain).super_TPZVec<long>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0181a058;
  uVar4 = geotomhm->fNElements;
  if ((long)uVar4 < 0xb) {
    plVar8 = (this->fGeoToMHMDomain).fExtAlloc;
    (this->fGeoToMHMDomain).super_TPZVec<long>.fStore = plVar8;
    (this->fGeoToMHMDomain).super_TPZVec<long>.fNElements = uVar4;
    (this->fGeoToMHMDomain).super_TPZVec<long>.fNAlloc = 0;
    if ((long)uVar4 < 1) goto LAB_013954c7;
  }
  else {
    plVar8 = (long *)operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 * 8);
    (this->fGeoToMHMDomain).super_TPZVec<long>.fStore = plVar8;
    (this->fGeoToMHMDomain).super_TPZVec<long>.fNElements = uVar4;
    (this->fGeoToMHMDomain).super_TPZVec<long>.fNAlloc = uVar4;
  }
  plVar5 = geotomhm->fStore;
  uVar10 = 0;
  do {
    plVar8[uVar10] = plVar5[uVar10];
    uVar10 = uVar10 + 1;
  } while (uVar4 != uVar10);
LAB_013954c7:
  p_Var2 = &(this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header;
  *(undefined1 (*) [16])&(this->fMHMtoSubCMesh)._M_t._M_impl = (undefined1  [16])0x0;
  (this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->fInterfaces)._M_t._M_impl.super__Rb_tree_header;
  (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header;
  (this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  *(undefined4 *)
   ((long)&(this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_node_count +
   7) = 0;
  (this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined4 *)&this->fGlobalSystemSize = 0xffffffff;
  *(undefined4 *)((long)&this->fGlobalSystemSize + 4) = 0xffffffff;
  *(undefined4 *)&this->fGlobalSystemWithLocalCondensationSize = 0xffffffff;
  *(undefined4 *)((long)&this->fGlobalSystemWithLocalCondensationSize + 4) = 0xffffffff;
  this->fNumeq = -1;
  if ((gmesh->fRef != (TPZReference *)0x0) && (gmesh->fRef->fPointer != (TPZGeoMesh *)0x0)) {
    this->fpOrderInternal = 2;
    this->fpOrderSkeleton = 1;
    lVar12 = geotomhm->fNElements;
    if (0 < lVar12) {
      lVar11 = 0;
      do {
        pmVar9 = std::
                 map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
                 operator[](&this->fMHMtoSubCMesh,
                            (key_type_conflict1 *)((long)geotomhm->fStore + lVar11));
        *pmVar9 = -1;
        lVar11 = lVar11 + 8;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
    }
    pTVar6 = local_38;
    this_01 = (TPZMultiphysicsCompMesh *)operator_new(0x9a8);
    local_50.fRef = pTVar6->fRef;
    LOCK();
    ((local_50.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_50.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    TPZMultiphysicsCompMesh::TPZMultiphysicsCompMesh(this_01,&local_50);
    TPZAutoPointer<TPZCompMesh>::operator=(this_00,this_01);
    TPZAutoPointer<TPZGeoMesh>::~TPZAutoPointer(&local_50);
    this_00->fRef->fPointer->fDimModel = pTVar6->fRef->fPointer->fDim;
    TPZAutoPointer<TPZCompMesh>::operator=(local_40,this_00);
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
             ,0x29);
}

Assistant:

TPZMHMeshControl::TPZMHMeshControl(TPZAutoPointer<TPZGeoMesh> gmesh, TPZVec<int64_t> &geotomhm) : fGMesh(gmesh), fProblemType(EScalar), fNState(1), fGeoToMHMDomain(geotomhm), fMHMtoSubCMesh(), fGlobalSystemSize(-1), fGlobalSystemWithLocalCondensationSize(-1), fNumeq(-1)
{
    if(!gmesh) DebugStop();
#ifdef PZDEBUG
    if (geotomhm.size() != fGMesh->NElements()) {
        DebugStop();
    }
#endif
    fpOrderInternal = 2;
    fpOrderSkeleton = 1;

    int64_t nc = geotomhm.size();
    for (int64_t c=0; c<nc; c++) {
        fMHMtoSubCMesh[geotomhm[c] ] = -1;
    }
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "Coarse element indexes ";
        for (std::map<int64_t,int64_t>::iterator it=fMHMtoSubCMesh.begin(); it != fMHMtoSubCMesh.end(); it++) {
            sout << *it << " ";
        }
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    fCMesh = new TPZMultiphysicsCompMesh(fGMesh);
    fCMesh->SetDimModel(fGMesh->Dimension());
    fPressureFineMesh = fCMesh;
}